

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O0

ThreadCachePtr tcmalloc::ThreadCachePtr::GetSlow(void)

{
  bool bVar1;
  ThreadCache *ptr;
  undefined8 *puVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  ThreadCachePtr TVar3;
  ThreadCachePtr TVar4;
  undefined1 local_70 [8];
  Entry registration;
  ThreadCache *local_38;
  ThreadCache *cache;
  Result tr;
  undefined1 local_10;
  
  SlowTLS::Lookup();
  bVar1 = SlowTLS::Result::Found((Result *)&cache);
  if (bVar1) {
    bVar1 = SlowTLS::Result::IsEmergencyMalloc((Result *)&cache);
    if (bVar1) {
      ThreadCachePtr((ThreadCachePtr *)&tr.entry_,(ThreadCache *)0x0,true);
      TVar3._8_8_ = extraout_RDX;
      TVar3.ptr_ = (ThreadCache *)tr.entry_;
      goto LAB_0013b15e;
    }
    local_38 = SlowTLS::TryToReleaseCacheFromAllocation((Result *)&cache);
    if (local_38 == (ThreadCache *)0x0) {
      ptr = SlowTLS::Result::GetCache((Result *)&cache);
      ThreadCachePtr((ThreadCachePtr *)&tr.entry_,ptr,false);
      TVar3._8_8_ = extraout_RDX_00;
      TVar3.ptr_ = (ThreadCache *)tr.entry_;
      goto LAB_0013b15e;
    }
  }
  else {
    bVar1 = ThreadCacheKeyIsReady();
    if (!bVar1) {
      TVar3 = GetReallySlow();
      local_10 = TVar3.is_emergency_malloc_;
      goto LAB_0013b15e;
    }
    local_38 = ThreadCache::NewHeap();
  }
  SlowTLS::Entry::Entry((Entry *)local_70,local_38);
  SlowTLS::RegisterEntry((Result *)&cache,(Entry *)local_70);
  SetTlsValue(tls_key_,local_38);
  SlowTLS::UnregisterEntry((Entry *)local_70);
  puVar2 = (undefined8 *)tls_data_();
  *puVar2 = local_38;
  ThreadCachePtr((ThreadCachePtr *)&tr.entry_,local_38,false);
  TVar3._8_8_ = extraout_RDX_01;
  TVar3.ptr_ = (ThreadCache *)tr.entry_;
LAB_0013b15e:
  tr.entry_ = (Entry *)TVar3.ptr_;
  TVar4._9_7_ = TVar3._9_7_;
  TVar4.is_emergency_malloc_ = (bool)local_10;
  TVar4.ptr_ = (ThreadCache *)tr.entry_;
  return TVar4;
}

Assistant:

ThreadCachePtr ThreadCachePtr::GetSlow() {
  // We're being called after GetIfPresent found no cache in normal
  // TLS storage.
  ASSERT(GetIfPresent() == nullptr);

  SlowTLS::Result tr = SlowTLS::Lookup();

  ThreadCache* cache;

  if (tr.Found()) {
    if (tr.IsEmergencyMalloc()) {
      return {nullptr, true};
    }

    // We found TLS entry with our cache. Lets check if we want try
    // convert this cache from pre-tls-ready mode to proper one.
    cache = SlowTLS::TryToReleaseCacheFromAllocation(&tr);
    if (cache == nullptr) {
      // If not, then we return the cache we got in the entry. This
      // must be thread cache instance being set inside ongoing
      // SetTlsValue.
      return {tr.GetCache(), false};
    }
  } else {
    if (!ThreadCacheKeyIsReady()) {
      return GetReallySlow();
    }
    // We're sure that everything is initialized enough to not just
    // create new ThreadCache instance, but to set it into TLS
    // storage.
    cache = ThreadCache::NewHeap();
  }

  SlowTLS::Entry registration{cache};

  // Register our newly created (or extracted from
  // TryToReleaseCacheFromAllocation) cache instance in slow
  // storage. So that if SetTlsValue below recurses back into malloc,
  // we're able to find it and avoid more SetTlsValue
  // recursion.
  SlowTLS::RegisterEntry(&tr, &registration);

  SetTlsValue(tls_key_, cache);

  SlowTLS::UnregisterEntry(&registration);

  // Note, we could set it before SetTlsValue above and actually
  // prevent any risk of SetTlsValue recursion. But since we want to
  // ensure test coverage for somewhat less common !kHaveGoodTLS
  // systems, lets have "good" systems run the "bad systems'" logic
  // too. For test coverage. Very slight performance hit for of the
  // SlowTLS registration for newly created threads we can afford.
  if constexpr (kHaveGoodTLS) {
    tls_data_.fast_path_cache = cache;
  }

  return {cache, false};
}